

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test_multiple_thread(void)

{
  uint uVar1;
  element_type *this;
  string str;
  person p;
  size_t i;
  bool r;
  shared_ptr<rest_rpc::rpc_client> client;
  int j;
  vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_> v;
  vector<std::shared_ptr<rest_rpc::rpc_client>,_std::allocator<std::shared_ptr<rest_rpc::rpc_client>_>_>
  cls;
  shared_ptr<rest_rpc::rpc_client> *in_stack_fffffffffffffec8;
  string *this_00;
  string *in_stack_fffffffffffffed8;
  allocator *in_stack_fffffffffffffee0;
  allocator *__args;
  string local_100 [32];
  shared_ptr<rest_rpc::rpc_client> local_e0 [2];
  allocator local_b9;
  undefined4 local_b8;
  string local_b0 [32];
  undefined4 local_90;
  ulong local_88;
  int local_80;
  allocator local_79;
  string local_78 [35];
  byte local_55;
  int local_34;
  
  std::
  vector<std::shared_ptr<rest_rpc::rpc_client>,_std::allocator<std::shared_ptr<rest_rpc::rpc_client>_>_>
  ::vector((vector<std::shared_ptr<rest_rpc::rpc_client>,_std::allocator<std::shared_ptr<rest_rpc::rpc_client>_>_>
            *)0x1b0814);
  std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>::vector
            ((vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_> *
             )0x1b0821);
  for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
    std::make_shared<rest_rpc::rpc_client>();
    std::
    vector<std::shared_ptr<rest_rpc::rpc_client>,_std::allocator<std::shared_ptr<rest_rpc::rpc_client>_>_>
    ::push_back((vector<std::shared_ptr<rest_rpc::rpc_client>,_std::allocator<std::shared_ptr<rest_rpc::rpc_client>_>_>
                 *)in_stack_fffffffffffffee0,(value_type *)in_stack_fffffffffffffed8);
    this = std::__shared_ptr_access<rest_rpc::rpc_client,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<rest_rpc::rpc_client,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b086d);
    __args = &local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"127.0.0.1",__args);
    uVar1 = rest_rpc::rpc_client::connect(this,(int)local_78,(sockaddr *)0x2328,0);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    local_55 = (byte)uVar1 & 1;
    if ((uVar1 & 1) == 0) {
      local_80 = 1;
    }
    else {
      for (local_88 = 0; local_88 < 2; local_88 = local_88 + 1) {
        local_b8 = 1;
        in_stack_fffffffffffffed8 = local_b0;
        in_stack_fffffffffffffee0 = &local_b9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(in_stack_fffffffffffffed8,"tom",in_stack_fffffffffffffee0);
        local_90 = 0x14;
        std::allocator<char>::~allocator((allocator<char> *)&local_b9);
        std::shared_ptr<rest_rpc::rpc_client>::shared_ptr(local_e0,in_stack_fffffffffffffec8);
        std::make_shared<std::thread,test_multiple_thread()::__0>((type *)__args);
        std::vector<std::shared_ptr<std::thread>,std::allocator<std::shared_ptr<std::thread>>>::
        emplace_back<std::shared_ptr<std::thread>>
                  ((vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
                    *)in_stack_fffffffffffffee0,(shared_ptr<std::thread> *)in_stack_fffffffffffffed8
                  );
        std::shared_ptr<std::thread>::~shared_ptr((shared_ptr<std::thread> *)0x1b0a39);
        test_multiple_thread()::$_0::~__0((type *)0x1b0a43);
        person::~person((person *)0x1b0a50);
      }
      local_80 = 0;
    }
    std::shared_ptr<rest_rpc::rpc_client>::~shared_ptr((shared_ptr<rest_rpc::rpc_client> *)0x1b0af1)
    ;
    if (local_80 != 0) goto LAB_001b0b5a;
  }
  this_00 = local_100;
  std::__cxx11::string::string(this_00);
  std::operator>>((istream *)&std::cin,this_00);
  std::__cxx11::string::~string(local_100);
  local_80 = 0;
LAB_001b0b5a:
  std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>::~vector
            ((vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_> *
             )in_stack_fffffffffffffee0);
  std::
  vector<std::shared_ptr<rest_rpc::rpc_client>,_std::allocator<std::shared_ptr<rest_rpc::rpc_client>_>_>
  ::~vector((vector<std::shared_ptr<rest_rpc::rpc_client>,_std::allocator<std::shared_ptr<rest_rpc::rpc_client>_>_>
             *)in_stack_fffffffffffffee0);
  return;
}

Assistant:

void test_multiple_thread() {
  std::vector<std::shared_ptr<rpc_client>> cls;
  std::vector<std::shared_ptr<std::thread>> v;
  for (int j = 0; j < 4; ++j) {
    auto client = std::make_shared<rpc_client>();
    cls.push_back(client);
    bool r = client->connect("127.0.0.1", 9000);
    if (!r) {
      return;
    }

    for (size_t i = 0; i < 2; i++) {
      person p{1, "tom", 20};
      v.emplace_back(std::make_shared<std::thread>([client] {
        person p{1, "tom", 20};
        for (size_t i = 0; i < 1000000; i++) {
          client->async_call<0>(
              "get_name",
              [](const asio::error_code &ec, string_view data) {
                if (ec) {
                  std::cout << ec.message() << '\n';
                }
              },
              p);

          // auto future = client->async_call<FUTURE>("get_name", p);
          // auto status = future.wait_for(std::chrono::seconds(2));
          // if (status == std::future_status::deferred) {
          //	std::cout << "deferred\n";
          //}
          // else if (status == std::future_status::timeout) {
          //	std::cout << "timeout\n";
          //}
          // else if (status == std::future_status::ready) {
          //}

          // client->call<std::string>("get_name", p);
        }
      }));
    }
  }

  std::string str;
  std::cin >> str;
}